

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall
cppcms::widgets::base_widget::generate(base_widget *this,int position,form_context *param_2)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  if ((this->field_0x1f0 & 0x10) == 0) {
    if ((this->name_)._M_string_length == 0) {
      impl::todec_string<int>(&local_38,position);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x241ac7);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_48 = *plVar2;
        lStack_40 = plVar1[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar2;
        local_58 = (long *)*plVar1;
      }
      local_50 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    this->field_0x1f0 = this->field_0x1f0 | 0x10;
  }
  return;
}

Assistant:

void base_widget::generate(int position,form_context * /*context*/)
{
	if(is_generation_done_)
		return;
	if(name_.empty()) {
		name_ = "_" + impl::todec_string(position);
	}
	is_generation_done_ = 1;
}